

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll-test.c
# Opt level: O0

void sleep_argument_impl(int sleep)

{
  int iVar1;
  int iVar2;
  pthread_t local_30;
  pthread_t writer_thread;
  epoll_event event;
  int fds [3];
  int ep;
  int sleep_local;
  
  iVar1 = epoll_create1(0x80000);
  if (iVar1 < 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x1d2,"ep >= 0");
  }
  fd_pipe(&event.data.fd);
  writer_thread._0_4_ = 1;
  iVar2 = epoll_ctl(iVar1,1,event.data.fd,(epoll_event *)&writer_thread);
  if (iVar2 < 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x1da,"epoll_ctl(ep, EPOLL_CTL_ADD, fds[0], &event) >= 0");
  }
  iVar2 = pthread_create(&local_30,(pthread_attr_t *)0x0,sleep_then_write,
                         (void *)SEXT48(event.data.ptr._4_4_));
  if (iVar2 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x1de,
               "pthread_create(&writer_thread, NULL, sleep_then_write, (void *)(intptr_t)(fds[1])) == 0"
              );
  }
  iVar2 = epoll_wait(iVar1,(epoll_event *)&writer_thread,1,sleep);
  if (iVar2 != 1) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x1e0,"epoll_wait(ep, &event, 1, sleep) == 1");
  }
  iVar2 = pthread_join(local_30,(void **)0x0);
  if (iVar2 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x1e2,"pthread_join(writer_thread, NULL) == 0");
  }
  iVar2 = close(event.data.fd);
  if (iVar2 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x1e4,"close(fds[0]) == 0");
  }
  iVar2 = close(event.data.u64._4_4_);
  if (iVar2 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x1e5,"close(fds[1]) == 0");
  }
  if (fds[0] != -1) {
    iVar2 = close(fds[0]);
    if (iVar2 != 0) {
      microatf_fail_require
                ("%s:%d: %s not met",
                 "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
                 ,0x1e6,"fds[2] == -1 || close(fds[2]) == 0");
    }
  }
  iVar1 = close(iVar1);
  if (iVar1 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x1e7,"close(ep) == 0");
  }
  return;
}

Assistant:

static void
sleep_argument_impl(int sleep)
{
	int ep = epoll_create1(EPOLL_CLOEXEC);
	ATF_REQUIRE(ep >= 0);

	int fds[3];
	fd_pipe(fds);

	struct epoll_event event;
	event.events = EPOLLIN;

	ATF_REQUIRE(epoll_ctl(ep, EPOLL_CTL_ADD, fds[0], &event) >= 0);

	pthread_t writer_thread;
	ATF_REQUIRE(pthread_create(&writer_thread, NULL, sleep_then_write,
			(void *)(intptr_t)(fds[1])) == 0);

	ATF_REQUIRE(epoll_wait(ep, &event, 1, sleep) == 1);

	ATF_REQUIRE(pthread_join(writer_thread, NULL) == 0);

	ATF_REQUIRE(close(fds[0]) == 0);
	ATF_REQUIRE(close(fds[1]) == 0);
	ATF_REQUIRE(fds[2] == -1 || close(fds[2]) == 0);
	ATF_REQUIRE(close(ep) == 0);
}